

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [41],unsigned_long *params_1,
          char (*params_2) [9],char **params_3,char *params_4)

{
  char *__s;
  undefined7 in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [24];
  size_t local_60;
  CappedArray<char,_26UL> local_58;
  
  local_60 = strlen((char *)this);
  local_78._16_8_ = this;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(unsigned_long *)*params);
  local_78._8_8_ = strlen((char *)params_1);
  __s = *(char **)*params_2;
  local_78._0_8_ = params_1;
  local_88.size_ = strlen(__s);
  local_88.ptr = __s;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)(local_78 + 0x10),(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)local_78,&local_88,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff6f,
             (FixedArray<char,_1UL> *)CONCAT17(*(undefined1 *)params_3,in_stack_ffffffffffffff68));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}